

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_number(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  int iVar1;
  char cVar2;
  int_type iVar3;
  token_type tVar4;
  char *pcVar5;
  int *piVar6;
  ulonglong uVar7;
  longlong lVar8;
  int iVar9;
  double dVar10;
  char *endptr;
  char *local_28;
  
  reset(this);
  iVar1 = this->current;
  iVar9 = 5;
  cVar2 = (char)this;
  if (iVar1 - 0x31U < 9) {
LAB_0014f845:
    do {
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
    } while (iVar3 - 0x30U < 10);
    if (iVar3 == 0x2e) {
LAB_0014f968:
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
      if (9 < iVar3 - 0x30U) {
        pcVar5 = "invalid number; expected digit after \'.\'";
        goto LAB_0014f992;
      }
      do {
        std::__cxx11::string::push_back(cVar2 + 'H');
        iVar3 = get(this);
      } while (iVar3 - 0x30U < 10);
      if ((iVar3 == 0x65) || (iVar3 == 0x45)) goto LAB_0014f881;
      iVar9 = 7;
    }
    else if ((iVar3 == 0x45) || (iVar3 == 0x65)) {
LAB_0014f881:
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
      if (9 < iVar3 - 0x30U) {
        if ((iVar3 == 0x2d) || (iVar3 == 0x2b)) {
          std::__cxx11::string::push_back(cVar2 + 'H');
          iVar3 = get(this);
          if (iVar3 - 0x30U < 10) goto LAB_0014f900;
          pcVar5 = "invalid number; expected digit after exponent sign";
        }
        else {
          pcVar5 = "invalid number; expected \'+\', \'-\', or digit after exponent";
        }
        goto LAB_0014f992;
      }
LAB_0014f900:
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar3 = get(this);
      iVar9 = 7;
      if (iVar3 - 0x30U < 10) {
        lexer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
        ::scan_number();
      }
    }
LAB_0014f9d3:
    unget(this);
    local_28 = (char *)0x0;
    piVar6 = __errno_location();
    *piVar6 = 0;
    if (iVar9 == 6) {
      lVar8 = strtoll((this->token_buffer)._M_dataplus._M_p,&local_28,10);
      if (*piVar6 == 0) {
        this->value_integer = lVar8;
        return value_integer;
      }
    }
    else if ((iVar9 == 5) &&
            (uVar7 = strtoull((this->token_buffer)._M_dataplus._M_p,&local_28,10), *piVar6 == 0)) {
      this->value_unsigned = uVar7;
      return value_unsigned;
    }
    dVar10 = strtod((this->token_buffer)._M_dataplus._M_p,&local_28);
    this->value_float = dVar10;
    tVar4 = value_float;
  }
  else {
    if (iVar1 == 0x30) {
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar9 = 5;
LAB_0014f948:
      iVar3 = get(this);
      if (iVar3 != 0x2e) {
        if ((iVar3 == 0x65) || (iVar3 == 0x45)) goto LAB_0014f881;
        goto LAB_0014f9d3;
      }
      goto LAB_0014f968;
    }
    if (iVar1 == 0x2d) {
      std::__cxx11::string::push_back(cVar2 + 'H');
    }
    iVar3 = get(this);
    if (iVar3 - 0x31U < 9) {
      iVar9 = 6;
      goto LAB_0014f845;
    }
    if (iVar3 == 0x30) {
      std::__cxx11::string::push_back(cVar2 + 'H');
      iVar9 = 6;
      goto LAB_0014f948;
    }
    pcVar5 = "invalid number; expected digit after \'-\'";
LAB_0014f992:
    this->error_message = pcVar5;
    tVar4 = parse_error;
  }
  return tVar4;
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto]
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // all other characters are rejected outside scan_number()
            default:            // LCOV_EXCL_LINE
                assert(false);  // LCOV_EXCL_LINE
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr;
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            assert(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        assert(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }